

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::writeOp<(moira::Core)1,(moira::Mode)2,4,64ull>(Moira *this,int n,u32 val)

{
  u32 addr;
  u32 ea;
  u32 val_local;
  int n_local;
  Moira *this_local;
  
  this->writeBuffer = (u16)(val >> 0x10);
  addr = computeEA<(moira::Core)1,(moira::Mode)2,4,0ull>(this,n);
  updateAnPD<(moira::Mode)2,4>(this,n);
  writeM<(moira::Core)1,(moira::Mode)2,4,64ull>(this,addr,val);
  updateAnPI<(moira::Mode)2,4>(this,n);
  return;
}

Assistant:

void
Moira::writeOp(int n, u32 val)
{
    switch (M) {

        case Mode::DN: writeD<S>(n, val); break;
        case Mode::AN: writeA<S>(n, val); break;
        case Mode::IM: fatalError;

        default:

            writeBuffer = (S == Long) ? u16(val >> 16) : u16(val & 0xFFFF);

            // Compute effective address
            u32 ea = computeEA<C, M, S>(n);

            // Emulate -(An) register modification
            updateAnPD<M, S>(n);

            // Write to effective address
            writeM<C, M, S, F>(ea, val);

            // Emulate (An)+ register modification
            updateAnPI<M, S>(n);
    }
}